

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void wallet::UpdateWalletSetting
               (Chain *chain,string *wallet_name,optional<bool> load_on_startup,
               vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  bool bVar1;
  bool *pbVar2;
  allocator<char> *in_RCX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  bilingual_str *in_stack_fffffffffffffed8;
  optional<bool> *in_stack_fffffffffffffee8;
  bilingual_str *in_stack_fffffffffffffef0;
  bilingual_str *__args;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff10;
  allocator<char> *__a;
  undefined1 local_cc [196];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::optional::operator_cast_to_bool((optional<bool> *)in_stack_fffffffffffffed8);
  if (bVar1) {
    pbVar2 = std::optional<bool>::value(in_stack_fffffffffffffee8);
    if (((*pbVar2 & 1U) == 0) ||
       (bVar1 = AddWalletSetting((Chain *)in_RCX,in_stack_ffffffffffffff10), bVar1)) {
      pbVar2 = std::optional<bool>::value(in_stack_fffffffffffffee8);
      if (((*pbVar2 & 1U) == 0) &&
         (bVar1 = RemoveWalletSetting((Chain *)in_RCX,in_stack_ffffffffffffff10), !bVar1)) {
        __args = (bilingual_str *)local_cc;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(in_RDI,in_RSI,in_RCX);
        Untranslated(in_stack_ffffffffffffff10);
        std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                  (in_stack_fffffffffffffef8,__args);
        bilingual_str::~bilingual_str(in_stack_fffffffffffffed8);
        std::__cxx11::string::~string(&in_stack_fffffffffffffed8->original);
        std::allocator<char>::~allocator((allocator<char> *)local_cc);
      }
    }
    else {
      __a = in_RCX;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(in_RDI,in_RSI,__a);
      Untranslated(in_stack_ffffffffffffff10);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_RCX,
                 in_stack_fffffffffffffef0);
      bilingual_str::~bilingual_str(in_stack_fffffffffffffed8);
      std::__cxx11::string::~string(&in_stack_fffffffffffffed8->original);
      std::allocator<char>::~allocator((allocator<char> *)(local_cc + 1));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void UpdateWalletSetting(interfaces::Chain& chain,
                                const std::string& wallet_name,
                                std::optional<bool> load_on_startup,
                                std::vector<bilingual_str>& warnings)
{
    if (!load_on_startup) return;
    if (load_on_startup.value() && !AddWalletSetting(chain, wallet_name)) {
        warnings.emplace_back(Untranslated("Wallet load on startup setting could not be updated, so wallet may not be loaded next node startup."));
    } else if (!load_on_startup.value() && !RemoveWalletSetting(chain, wallet_name)) {
        warnings.emplace_back(Untranslated("Wallet load on startup setting could not be updated, so wallet may still be loaded next node startup."));
    }
}